

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlbackend.h
# Opt level: O2

void __thiscall rengine::SDLBackend::SDLBackend(SDLBackend *this)

{
  int iVar1;
  ostream *poVar2;
  string local_38 [32];
  
  Backend::Backend(&this->super_Backend);
  (this->super_Backend)._vptr_Backend = (_func_int **)&PTR__SDLBackend_0012e788;
  (this->super_SurfaceBackendImpl)._vptr_SurfaceBackendImpl = (_func_int **)&DAT_0012e808;
  this->m_surface = (Surface *)0x0;
  this->m_window = (SDL_Window *)0x0;
  *(undefined8 *)((long)&this->m_window + 1) = 0;
  *(undefined8 *)((long)&this->m_gl + 1) = 0;
  iVar1 = SDL_Init(0x20);
  if (iVar1 < 0) {
    SDLBackend_die("Unable to initialize SDL");
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"I [");
  log_timestring_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,local_38);
  poVar2 = std::operator<<(poVar2,"]: ");
  poVar2 = std::operator<<(poVar2,"SDLBackend: created...");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

SDLBackend()
    {
        if (SDL_Init(SDL_INIT_VIDEO) < 0)
            SDLBackend_die("Unable to initialize SDL");
        logi << "SDLBackend: created..." << std::endl;
    }